

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

void write_apu(Emulator *e,MaskedAddress addr,u8 value)

{
  byte bVar1;
  SweepDirection SVar2;
  ulong uVar3;
  char cVar4;
  Bool BVar5;
  char *pcVar6;
  char *pcVar7;
  Address AVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  undefined6 in_register_00000032;
  Channel *pCVar12;
  char *pcVar13;
  WaveVolume WVar14;
  ushort uVar15;
  
  pcVar13 = (char *)CONCAT62(in_register_00000032,addr);
  if ((((e->config).log_apu_writes != FALSE) || ((e->state).apu.initialized == FALSE)) &&
     (uVar3 = (e->apu_log).write_count, uVar3 < 0x400)) {
    (e->apu_log).write_count = uVar3 + 1;
    (e->apu_log).writes[uVar3].addr = (u8)((ulong)pcVar13 & 0xffffffff);
    (e->apu_log).writes[uVar3].value = value;
  }
  uVar15 = (ushort)((ulong)pcVar13 & 0xffffffff);
  if ((e->state).apu.enabled == FALSE) {
    if ((e->state).is_cgb == FALSE) {
      if ((0x16 < uVar15) || ((0x410842U >> (addr & 0x1f) & 1) == 0)) goto LAB_0018b6ba;
    }
    else if (uVar15 != 0x16) {
LAB_0018b6ba:
      pcVar6 = "unknown";
      if (uVar15 < 0x17) {
        pcVar6 = *(char **)(get_apu_reg_string_s_strings + (ulong)addr * 8);
      }
      pcVar7 = "unknown";
      if (pcVar6 != (char *)0x0) {
        pcVar7 = pcVar6;
      }
      HOOK_write_apu_disabled_asb(e,pcVar13,(ulong)addr,pcVar7,value);
      return;
    }
  }
  if ((e->state).apu.initialized != FALSE) {
    apu_synchronize(e);
  }
  uVar3 = (ulong)addr;
  pcVar6 = "unknown";
  if (uVar15 < 0x17) {
    pcVar6 = *(char **)(get_apu_reg_string_s_strings + uVar3 * 8);
  }
  pcVar7 = "unknown";
  if (pcVar6 != (char *)0x0) {
    pcVar7 = pcVar6;
  }
  HOOK_write_apu_asb(e,pcVar13,uVar3,pcVar7,value);
  if (0x16 < uVar15) {
    return;
  }
  switch((long)&switchD_0018b646::switchdataD_001beaa0 +
         (long)(int)(&switchD_0018b646::switchdataD_001beaa0)[uVar3]) {
  case 0x18b648:
    SVar2 = (e->state).apu.sweep.direction;
    (e->state).apu.sweep.period = value >> 4 & 7;
    (e->state).apu.sweep.direction = value >> 3 & SWEEP_DIRECTION_SUBTRACTION;
    (e->state).apu.sweep.shift = value & 7;
    if ((((value >> 3 & 1) == 0) && (SVar2 == SWEEP_DIRECTION_SUBTRACTION)) &&
       ((e->state).apu.sweep.calculated_subtract != FALSE)) {
      (e->state).apu.channel[0].status = FALSE;
    }
    break;
  case 0x18b712:
    (e->state).apu.so_output[4][1] = (uint)(value >> 7);
    (e->state).apu.so_volume[1] = value >> 4 & 7;
    (e->state).apu.so_output[4][0] = value >> 3 & TRUE;
    (e->state).apu.so_volume[0] = value & 7;
    break;
  case 0x18b74a:
    pCVar12 = (e->state).apu.channel + 2;
    BVar5 = write_nrx4_reg(e,pCVar12,0xe,value,0x100);
    uVar15 = (e->state).apu.channel[2].frequency;
    (e->state).apu.wave.period = (uint)uVar15 * -2 + 0x1000;
    HOOK_write_wave_period_info_iii
              (e,(char *)pCVar12,(ulong)uVar15,(ulong)(e->state).apu.wave.ticks);
    if (BVar5 != FALSE) {
      if ((((e->state).is_cgb == FALSE) && ((e->state).apu.wave.playing != FALSE)) &&
         ((e->state).apu.wave.ticks == 2)) {
        bVar1 = (e->state).apu.wave.position;
        if (0x1f < bVar1) {
          __assert_fail("WAVE.position < 32",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                        ,0xc53,"void write_apu(Emulator *, MaskedAddress, u8)");
        }
        uVar9 = bVar1 + 1 & 0x1f;
        uVar11 = uVar9 >> 1;
        if ((byte)uVar9 < 8) {
          (e->state).apu.wave.ram[0] = (e->state).apu.wave.ram[uVar11];
        }
        else {
          *(undefined4 *)(e->state).apu.wave.ram =
               *(undefined4 *)((e->state).apu.wave.ram + (uVar11 & 0xfffffffc));
        }
        HOOK_corrupt_wave_ram_i(e,(char *)pCVar12);
      }
      (e->state).apu.wave.position = '\0';
      (e->state).apu.wave.ticks = (e->state).apu.wave.period + 6;
      (e->state).apu.wave.playing = TRUE;
    }
    break;
  case 0x18b7cd:
    (e->state).apu.channel[2].length = 0x100 - value;
    break;
  case 0x18b7e1:
    uVar15 = CONCAT11(*(undefined1 *)((long)&(e->state).apu.channel[2].frequency + 1),value);
    (e->state).apu.channel[2].frequency = uVar15;
    (e->state).apu.wave.period = (uint)uVar15 * -2 + 0x1000;
    HOOK_write_wave_period_info_iii(e,pcVar13,(ulong)(uint)uVar15,(ulong)(e->state).apu.wave.ticks);
    return;
  case 0x18b820:
    (e->state).apu.so_output[3][1] = (uint)(value >> 7);
    (e->state).apu.so_output[2][1] = value >> 6 & TRUE;
    (e->state).apu.so_output[1][1] = value >> 5 & TRUE;
    (e->state).apu.so_output[0][1] = value >> 4 & TRUE;
    (e->state).apu.so_output[3][0] = value >> 3 & TRUE;
    (e->state).apu.so_output[2][0] = value >> 2 & TRUE;
    (e->state).apu.so_output[1][0] = value >> 1 & TRUE;
    (e->state).apu.so_output[0][0] = value & TRUE;
    break;
  case 0x18b895:
    pCVar12 = (e->state).apu.channel;
    AVar8 = 2;
    goto LAB_0018b965;
  case 0x18b8a9:
    pCVar12 = (e->state).apu.channel + 1;
    AVar8 = 6;
    goto LAB_0018b946;
  case 0x18b8bd:
    WVar14 = value >> 5 & WAVE_VOLUME_25;
    (e->state).apu.wave.volume = WVar14;
    (e->state).apu.wave.volume_shift = "\x04"[WVar14];
    break;
  case 0x18b8e2:
    pCVar12 = (e->state).apu.channel;
    AVar8 = 1;
    goto LAB_0018b946;
  case 0x18b8f3:
    pCVar12 = (e->state).apu.channel + 1;
    AVar8 = 7;
    goto LAB_0018b965;
  case 0x18b904:
    uVar15 = CONCAT11(*(undefined1 *)((long)&(e->state).apu.channel[1].frequency + 1),value);
    uVar9 = (uint)uVar15;
    (e->state).apu.channel[1].frequency = uVar15;
    (e->state).apu.channel[1].square_wave.period = uVar9 * -4 + 0x2000;
    uVar11 = (e->state).apu.channel[1].square_wave.ticks;
LAB_0018b9a6:
    HOOK_write_square_wave_period_info_iii(e,pcVar13,(ulong)uVar9,(ulong)uVar11);
    return;
  case 0x18b937:
    pCVar12 = (e->state).apu.channel + 3;
    AVar8 = 0x10;
LAB_0018b946:
    write_nrx1_reg(e,pCVar12,AVar8,value);
    return;
  case 0x18b956:
    pCVar12 = (e->state).apu.channel + 3;
    AVar8 = 0x11;
LAB_0018b965:
    write_nrx2_reg(e,pCVar12,AVar8,value);
    return;
  case 0x18b975:
    uVar15 = CONCAT11(*(undefined1 *)((long)&(e->state).apu.channel[0].frequency + 1),value);
    uVar9 = (uint)uVar15;
    (e->state).apu.channel[0].frequency = uVar15;
    (e->state).apu.channel[0].square_wave.period = uVar9 * -4 + 0x2000;
    uVar11 = (e->state).apu.channel[0].square_wave.ticks;
    goto LAB_0018b9a6;
  case 0x18b9b8:
    pCVar12 = (e->state).apu.channel;
    BVar5 = write_nrx4_reg(e,pCVar12,4,value,0x40);
    uVar15 = (e->state).apu.channel[0].frequency;
    (e->state).apu.channel[0].square_wave.period = (uint)uVar15 * -4 + 0x2000;
    HOOK_write_square_wave_period_info_iii
              (e,(char *)pCVar12,(ulong)uVar15,(ulong)(e->state).apu.channel[0].square_wave.ticks);
    if (BVar5 == FALSE) {
      return;
    }
    trigger_nrx4_envelope(e,&(e->state).apu.channel[0].envelope,4);
    uVar11 = *(uint *)&(e->state).apu.sweep;
    cVar4 = (char)uVar11;
    bVar1 = (e->state).apu.sweep.shift;
    pcVar13 = (char *)0x8;
    if (cVar4 != '\0') {
      pcVar13 = (char *)(ulong)uVar11;
    }
    (e->state).apu.sweep.enabled = (uint)(bVar1 != 0 || cVar4 != '\0');
    uVar15 = (e->state).apu.channel[0].frequency;
    (e->state).apu.sweep.frequency = uVar15;
    (e->state).apu.sweep.timer = (u8)pcVar13;
    (e->state).apu.sweep.calculated_subtract = FALSE;
    if (bVar1 == 0) {
LAB_0018bc87:
      HOOK_trigger_nr14_info_i(e,pcVar13);
    }
    else {
      if ((e->state).apu.sweep.direction == SWEEP_DIRECTION_ADDITION) {
        uVar11 = (uint)(uVar15 >> (bVar1 & 0x1f)) + (uint)uVar15;
      }
      else {
        uVar11 = (uint)(uVar15 >> (bVar1 & 0x1f));
        pcVar13 = (char *)(ulong)uVar11;
        (e->state).apu.sweep.calculated_subtract = TRUE;
        uVar11 = uVar15 - uVar11;
      }
      if ((uVar11 & 0xffff) < 0x800) goto LAB_0018bc87;
      (e->state).apu.channel[0].status = FALSE;
      HOOK_trigger_nr14_sweep_overflow_v(e,pcVar13);
    }
    (e->state).apu.channel[0].square_wave.ticks = (e->state).apu.channel[0].square_wave.period;
    break;
  case 0x18ba93:
    (e->state).apu.channel[2].dac_enabled = (uint)(value >> 7);
    if (-1 < (char)value) {
      (e->state).apu.channel[2].status = FALSE;
      (e->state).apu.wave.playing = FALSE;
    }
    break;
  case 0x18baba:
    pCVar12 = (e->state).apu.channel + 1;
    BVar5 = write_nrx4_reg(e,pCVar12,9,value,0x40);
    uVar15 = (e->state).apu.channel[1].frequency;
    (e->state).apu.channel[1].square_wave.period = (uint)uVar15 * -4 + 0x2000;
    HOOK_write_square_wave_period_info_iii
              (e,(char *)pCVar12,(ulong)uVar15,(ulong)(e->state).apu.channel[1].square_wave.ticks);
    if (BVar5 != FALSE) {
      trigger_nrx4_envelope(e,&(e->state).apu.channel[1].envelope,9);
      (e->state).apu.channel[1].square_wave.ticks = (e->state).apu.channel[1].square_wave.period;
    }
    break;
  case 0x18bb34:
    BVar5 = write_nrx4_reg(e,(e->state).apu.channel + 3,0x13,value,0x40);
    if (BVar5 != FALSE) {
      write_noise_period(e);
      trigger_nrx4_envelope(e,&(e->state).apu.channel[3].envelope,0x13);
      (e->state).apu.noise.lfsr = 0x7fff;
      (e->state).apu.noise.sample = '\x01';
      (e->state).apu.noise.ticks = (e->state).apu.noise.period;
    }
    break;
  case 0x18bb96:
    (e->state).apu.noise.clock_shift = value >> 4;
    (e->state).apu.noise.lfsr_width = value >> 3 & LFSR_WIDTH_7;
    (e->state).apu.noise.divisor = value & 7;
    write_noise_period(e);
    return;
  case 0x18bbcb:
    BVar5 = (e->state).apu.enabled;
    if ((char)value < '\0' || BVar5 == FALSE) {
      if (BVar5 == FALSE && (char)value < '\0') {
        HOOK_apu_power_up_v(e,pcVar13);
        (e->state).apu.frame = '\a';
      }
    }
    else {
      iVar10 = 0;
      HOOK_apu_power_down_v(e,pcVar13);
      do {
        write_apu(e,(MaskedAddress)iVar10,'\0');
        iVar10 = iVar10 + 1;
      } while (iVar10 != 0x16);
    }
    (e->state).apu.enabled = (uint)(value >> 7);
  }
  return;
}

Assistant:

static void write_apu(Emulator* e, MaskedAddress addr, u8 value) {
  if (e->config.log_apu_writes || !APU.initialized) {
    if (e->apu_log.write_count < MAX_APU_LOG_FRAME_WRITES) {
      ApuWrite* write = &e->apu_log.writes[e->apu_log.write_count++];
      write->addr = addr;
      write->value = value;
    }
  }

  if (!APU.enabled) {
    if (!IS_CGB && (addr == APU_NR11_ADDR || addr == APU_NR21_ADDR ||
                    addr == APU_NR31_ADDR || addr == APU_NR41_ADDR)) {
      /* DMG allows writes to the length counters when power is disabled. */
    } else if (addr == APU_NR52_ADDR) {
      /* Always can write to NR52; it's necessary to re-enable power to APU. */
    } else {
      /* Ignore all other writes. */
      HOOK(write_apu_disabled_asb, addr, get_apu_reg_string(addr), value);
      return;
    }
  }

  if (APU.initialized) {
    apu_synchronize(e);
  }

  HOOK(write_apu_asb, addr, get_apu_reg_string(addr), value);
  switch (addr) {
    case APU_NR10_ADDR: {
      SweepDirection old_direction = SWEEP.direction;
      SWEEP.period = UNPACK(value, NR10_SWEEP_PERIOD);
      SWEEP.direction = UNPACK(value, NR10_SWEEP_DIRECTION);
      SWEEP.shift = UNPACK(value, NR10_SWEEP_SHIFT);
      if (old_direction == SWEEP_DIRECTION_SUBTRACTION &&
          SWEEP.direction == SWEEP_DIRECTION_ADDITION &&
          SWEEP.calculated_subtract) {
        CHANNEL1.status = FALSE;
      }
      break;
    }
    case APU_NR11_ADDR:
      write_nrx1_reg(e, &CHANNEL1, addr, value);
      break;
    case APU_NR12_ADDR:
      write_nrx2_reg(e, &CHANNEL1, addr, value);
      break;
    case APU_NR13_ADDR:
      write_nrx3_reg(e, &CHANNEL1, value);
      write_square_wave_period(e, &CHANNEL1, &CHANNEL1.square_wave);
      break;
    case APU_NR14_ADDR: {
      Bool trigger = write_nrx4_reg(e, &CHANNEL1, addr, value, NRX1_MAX_LENGTH);
      write_square_wave_period(e, &CHANNEL1, &CHANNEL1.square_wave);
      if (trigger) {
        trigger_nrx4_envelope(e, &CHANNEL1.envelope, addr);
        trigger_nr14_reg(e, &CHANNEL1);
        CHANNEL1.square_wave.ticks = CHANNEL1.square_wave.period;
      }
      break;
    }
    case APU_NR21_ADDR:
      write_nrx1_reg(e, &CHANNEL2, addr, value);
      break;
    case APU_NR22_ADDR:
      write_nrx2_reg(e, &CHANNEL2, addr, value);
      break;
    case APU_NR23_ADDR:
      write_nrx3_reg(e, &CHANNEL2, value);
      write_square_wave_period(e, &CHANNEL2, &CHANNEL2.square_wave);
      break;
    case APU_NR24_ADDR: {
      Bool trigger = write_nrx4_reg(e, &CHANNEL2, addr, value, NRX1_MAX_LENGTH);
      write_square_wave_period(e, &CHANNEL2, &CHANNEL2.square_wave);
      if (trigger) {
        trigger_nrx4_envelope(e, &CHANNEL2.envelope, addr);
        CHANNEL2.square_wave.ticks = CHANNEL2.square_wave.period;
      }
      break;
    }
    case APU_NR30_ADDR:
      CHANNEL3.dac_enabled = UNPACK(value, NR30_DAC_ENABLED);
      if (!CHANNEL3.dac_enabled) {
        CHANNEL3.status = FALSE;
        WAVE.playing = FALSE;
      }
      break;
    case APU_NR31_ADDR:
      CHANNEL3.length = NR31_MAX_LENGTH - value;
      break;
    case APU_NR32_ADDR:
      WAVE.volume = UNPACK(value, NR32_SELECT_WAVE_VOLUME);
      assert(WAVE.volume < WAVE_VOLUME_COUNT);
      WAVE.volume_shift = s_wave_volume_shift[WAVE.volume];
      break;
    case APU_NR33_ADDR:
      write_nrx3_reg(e, &CHANNEL3, value);
      write_wave_period(e, &CHANNEL3);
      break;
    case APU_NR34_ADDR: {
      Bool trigger = write_nrx4_reg(e, &CHANNEL3, addr, value, NR31_MAX_LENGTH);
      write_wave_period(e, &CHANNEL3);
      if (trigger) {
        if (!IS_CGB && WAVE.playing) {
          /* Triggering the wave channel while it is already playing will
           * corrupt the wave RAM on DMG. */
          if (WAVE.ticks == WAVE_TRIGGER_CORRUPTION_OFFSET_TICKS) {
            assert(WAVE.position < 32);
            u8 position = (WAVE.position + 1) & 31;
            u8 byte = WAVE.ram[position >> 1];
            switch (position >> 3) {
              case 0:
                WAVE.ram[0] = byte;
                break;
              case 1:
              case 2:
              case 3:
                memcpy(&WAVE.ram[0], &WAVE.ram[(position >> 1) & 12], 4);
                break;
            }
            HOOK(corrupt_wave_ram_i, position);
          }
        }

        WAVE.position = 0;
        WAVE.ticks = WAVE.period + WAVE_TRIGGER_DELAY_TICKS;
        WAVE.playing = TRUE;
      }
      break;
    }
    case APU_NR41_ADDR:
      write_nrx1_reg(e, &CHANNEL4, addr, value);
      break;
    case APU_NR42_ADDR:
      write_nrx2_reg(e, &CHANNEL4, addr, value);
      break;
    case APU_NR43_ADDR: {
      NOISE.clock_shift = UNPACK(value, NR43_CLOCK_SHIFT);
      NOISE.lfsr_width = UNPACK(value, NR43_LFSR_WIDTH);
      NOISE.divisor = UNPACK(value, NR43_DIVISOR);
      write_noise_period(e);
      break;
    }
    case APU_NR44_ADDR: {
      Bool trigger = write_nrx4_reg(e, &CHANNEL4, addr, value, NRX1_MAX_LENGTH);
      if (trigger) {
        write_noise_period(e);
        trigger_nrx4_envelope(e, &CHANNEL4.envelope, addr);
        NOISE.lfsr = 0x7fff;
        NOISE.sample = 1;
        NOISE.ticks = NOISE.period;
      }
      break;
    }
    case APU_NR50_ADDR:
      APU.so_output[VIN][1] = UNPACK(value, NR50_VIN_SO2);
      APU.so_volume[1] = UNPACK(value, NR50_SO2_VOLUME);
      APU.so_output[VIN][0] = UNPACK(value, NR50_VIN_SO1);
      APU.so_volume[0] = UNPACK(value, NR50_SO1_VOLUME);
      break;
    case APU_NR51_ADDR:
      APU.so_output[SOUND4][1] = UNPACK(value, NR51_SOUND4_SO2);
      APU.so_output[SOUND3][1] = UNPACK(value, NR51_SOUND3_SO2);
      APU.so_output[SOUND2][1] = UNPACK(value, NR51_SOUND2_SO2);
      APU.so_output[SOUND1][1] = UNPACK(value, NR51_SOUND1_SO2);
      APU.so_output[SOUND4][0] = UNPACK(value, NR51_SOUND4_SO1);
      APU.so_output[SOUND3][0] = UNPACK(value, NR51_SOUND3_SO1);
      APU.so_output[SOUND2][0] = UNPACK(value, NR51_SOUND2_SO1);
      APU.so_output[SOUND1][0] = UNPACK(value, NR51_SOUND1_SO1);
      break;
    case APU_NR52_ADDR: {
      Bool was_enabled = APU.enabled;
      Bool is_enabled = UNPACK(value, NR52_ALL_SOUND_ENABLED);
      if (was_enabled && !is_enabled) {
        HOOK0(apu_power_down_v);
        int i;
        for (i = 0; i < APU_REG_COUNT; ++i) {
          if (i != APU_NR52_ADDR) {
            write_apu(e, i, 0);
          }
        }
      } else if (!was_enabled && is_enabled) {
        HOOK0(apu_power_up_v);
        APU.frame = 7;
      }
      APU.enabled = is_enabled;
      break;
    }
  }
}